

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

DescriptorProto * __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::Add
          (RepeatedPtrField<google::protobuf::DescriptorProto> *this)

{
  int iVar1;
  DescriptorProto *pDVar2;
  int iVar3;
  
  iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
  iVar3 = (this->super_RepeatedPtrFieldBase).allocated_size_;
  if (iVar1 < iVar3) {
    (this->super_RepeatedPtrFieldBase).current_size_ = iVar1 + 1;
    pDVar2 = (DescriptorProto *)(this->super_RepeatedPtrFieldBase).elements_[iVar1];
  }
  else {
    if (iVar3 == (this->super_RepeatedPtrFieldBase).total_size_) {
      internal::RepeatedPtrFieldBase::Reserve(&this->super_RepeatedPtrFieldBase,iVar3 + 1);
      iVar3 = (this->super_RepeatedPtrFieldBase).allocated_size_;
    }
    (this->super_RepeatedPtrFieldBase).allocated_size_ = iVar3 + 1;
    pDVar2 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
    iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
    (this->super_RepeatedPtrFieldBase).current_size_ = iVar1 + 1;
    (this->super_RepeatedPtrFieldBase).elements_[iVar1] = pDVar2;
  }
  return pDVar2;
}

Assistant:

inline Element* RepeatedPtrField<Element>::Add() {
  return RepeatedPtrFieldBase::Add<TypeHandler>();
}